

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool-inl.h
# Opt level: O2

void __thiscall
spdlog::details::thread_pool::post_flush
          (thread_pool *this,async_logger_ptr *worker_ptr,async_overflow_policy overflow_policy)

{
  async_msg local_1b0;
  
  async_msg::async_msg(&local_1b0,worker_ptr,flush);
  post_async_msg_(this,&local_1b0,overflow_policy);
  async_msg::~async_msg(&local_1b0);
  return;
}

Assistant:

void SPDLOG_INLINE thread_pool::post_flush(async_logger_ptr &&worker_ptr, async_overflow_policy overflow_policy)
{
    post_async_msg_(async_msg(std::move(worker_ptr), async_msg_type::flush), overflow_policy);
}